

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::
emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>>
          (QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *this,
          unsigned_long_long *key,shared_ptr<const_QGradientCache::CacheInfo> *args)

{
  long lVar1;
  piter it;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *in_RCX;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *in_RDX;
  iterator *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *n;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RSI;
  QHashPrivate::
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  ::findOrInsert<unsigned_long_long>(in_RDX,(unsigned_long_long *)in_RCX);
  QHashPrivate::
  iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  ::node((iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
          *)in_RCX);
  QHashPrivate::MultiNode<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::
  createInPlace<std::shared_ptr<QGradientCache::CacheInfo_const>>
            ((MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *)n,
             (unsigned_long_long *)in_RDX,(shared_ptr<const_QGradientCache::CacheInfo> *)in_RCX);
  (in_RSI->i).bucket = (in_RSI->i).bucket + 1;
  it.bucket = (size_t)in_RDX;
  it.d = in_RCX;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::iterator::
  iterator(in_RSI,it,(Chain **)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }